

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O3

void __thiscall Editor::openBoard(Editor *this,bool ignoreUnsaved,path *filename)

{
  pointer pcVar1;
  double dVar2;
  source_loc loc;
  bool bVar3;
  logger *plVar4;
  undefined7 in_register_00000031;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view_t fmt;
  settings tmp;
  path openFilename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  openResult;
  allocator_type local_199;
  string local_198;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [24];
  string local_f0;
  path local_d0;
  file_dialog local_b0;
  path local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  path local_50;
  
  if (((int)CONCAT71(in_register_00000031,ignoreUnsaved) == 0) &&
     (this->lastEditSize_ != this->savedEditSize_)) {
    local_178._8_8_ = 0;
    local_160 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/Editor.cpp:447:42)>
                ::_M_invoke;
    local_168 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/Editor.cpp:447:42)>
                ::_M_manager;
    local_178._M_unused._M_object = this;
    EditorInterface::showSaveDialog(&this->interface_,(function<void_()> *)&local_178);
    if (local_168 == (code *)0x0) {
      return;
    }
    (*local_168)(&local_178,&local_178,3);
    return;
  }
  ghc::filesystem::path::path(&local_d0);
  bVar3 = ghc::filesystem::path::empty(filename);
  if (bVar3) {
    pfd::settings::settings((settings *)local_178._M_pod_data,false);
    if ((((pfd::settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') &&
         (pfd::settings::flags(pfd::settings::flag)::flags._3_1_ == '\0')) &&
        (pfd::settings::flags(pfd::settings::flag)::flags._4_1_ != '\x01')) &&
       (pfd::settings::flags(pfd::settings::flag)::flags._5_1_ != '\x01')) {
      plVar4 = spdlog::default_logger_raw();
      local_178._M_unused._M_object = (void *)0x0;
      local_178._8_8_ = 0;
      local_168 = (code *)0x0;
      dVar2 = spdlog::logger::log(plVar4,0.0);
      local_178._M_unused._M_object = &local_168;
      std::__cxx11::string::_M_construct<char_const*>(SUB84(dVar2,0),&local_178,"boards","");
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_198,local_178._M_unused._M_object,
                 local_178._8_8_ + (long)local_178._M_unused._0_8_);
      if ((code **)local_178._M_unused._0_8_ != &local_168) {
        operator_delete(local_178._M_unused._M_object);
      }
      ghc::filesystem::path::postprocess_path_with_format((path *)&local_198,auto_format);
      ghc::filesystem::operator/((path *)&local_f0,&this->workingDirectory_,(path *)&local_198);
      EditorInterface::showFileDialog(&this->interface_,true,(path *)&local_f0);
      ghc::filesystem::path::~path((path *)&local_f0);
      ghc::filesystem::path::~path((path *)&local_198);
      goto LAB_00146210;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Open","");
    local_178._M_unused._M_object = &local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"boards","");
    local_a0._path._M_dataplus._M_p = (pointer)&local_a0._path.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_a0,local_178._M_unused._M_object,
               local_178._8_8_ + (long)local_178._M_unused._0_8_);
    if ((code **)local_178._M_unused._0_8_ != &local_168) {
      operator_delete(local_178._M_unused._M_object);
    }
    ghc::filesystem::path::postprocess_path_with_format(&local_a0,auto_format);
    ghc::filesystem::operator/(&local_50,&this->workingDirectory_,&local_a0);
    ghc::filesystem::path::string_abi_cxx11_(&local_198,&local_50);
    local_178._M_unused._M_object = &local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Plain Text (*.txt)","");
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"*.txt","");
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"All Files (*.*)","");
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"*","");
    __l._M_len = 4;
    __l._M_array = (iterator)&local_178;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,__l,&local_199);
    pfd::internal::file_dialog::file_dialog(&local_b0,open,&local_f0,&local_198,&local_68,none);
    pfd::internal::file_dialog::vector_result_abi_cxx11_(&local_80,&local_b0);
    if (local_b0.super_dialog.m_async.
        super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super_dialog.m_async.
                 super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    lVar5 = 0;
    do {
      if (local_108 + lVar5 != *(undefined1 **)((long)local_118 + lVar5)) {
        operator_delete(*(undefined1 **)((long)local_118 + lVar5));
      }
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    ghc::filesystem::path::~path(&local_50);
    ghc::filesystem::path::~path(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_80.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_80.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar1 = ((local_80.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_178._M_unused._M_object = &local_168;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_178,pcVar1,
                 pcVar1 + (local_80.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)local_178._M_pod_data);
      if ((code **)local_178._M_unused._0_8_ != &local_168) {
        operator_delete(local_178._M_unused._M_object);
      }
      ghc::filesystem::path::postprocess_path_with_format(&local_d0,native_format);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
  }
  else {
    ghc::filesystem::path::operator=(&local_d0,filename);
  }
  bVar3 = ghc::filesystem::path::empty(&local_d0);
  if (bVar3) {
    plVar4 = spdlog::default_logger_raw();
    local_178._M_unused._M_object = (code **)0x0;
    local_178._8_8_ = 0;
    local_168 = (code *)0x0;
    spdlog::logger::log(plVar4,0.0);
  }
  else {
    deselectAll(this);
    plVar4 = spdlog::default_logger_raw();
    local_178._M_unused._M_object = (code **)0x0;
    local_178._8_8_ = 0;
    local_168 = (code *)0x0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0xf;
    fmt.data_ = "Loading \"{}\"...";
    spdlog::logger::log_<ghc::filesystem::path&>(plVar4,loc,info,fmt,&local_d0);
    Board::loadFromFile(this->board_,&local_d0);
    defaultZoom(this);
    std::
    deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
    ::clear(&this->editHistory_);
    this->lastEditSize_ = 0;
    this->savedEditSize_ = 0;
  }
LAB_00146210:
  ghc::filesystem::path::~path(&local_d0);
  return;
}

Assistant:

void Editor::openBoard(bool ignoreUnsaved, const fs::path& filename) {
    if (!ignoreUnsaved && isEditUnsaved()) {
        return interface_.showSaveDialog([this]() {
            openBoard(true);
        });
    }

    fs::path openFilename;
    if (!filename.empty()) {
        openFilename = filename;
    } else if (pfd::settings::available()) {
        auto openResult = pfd::open_file("Open", (workingDirectory_ / "boards").string(), {
            "Plain Text (*.txt)", "*.txt",
            "All Files (*.*)", "*"
        }, pfd::opt::none).result();

        if (!openResult.empty()) {
            openFilename = openResult[0];
        }
    } else {
        spdlog::warn("Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog.");
        return interface_.showFileDialog(true, workingDirectory_ / "boards");
    }

    if (!openFilename.empty()) {
        deselectAll();
        spdlog::info("Loading \"{}\"...", openFilename);
        board_.loadFromFile(openFilename);
        defaultZoom();
        editHistory_.clear();
        lastEditSize_ = 0;
        savedEditSize_ = 0;
    } else {
        spdlog::info("No file selected.");
    }
}